

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_and_array.cpp
# Opt level: O2

int vector_and_array(void)

{
  vector<double,_std::allocator<double>_> a2;
  double a1 [4];
  array<double,_4UL> a4;
  array<double,_4UL> a3;
  
  std::vector<double,_std::allocator<double>_>::vector(&a2,4,(allocator_type *)&a3);
  *a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       1.1;
  a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 1.2;
  a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 1.3;
  a2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 1.4;
  a3._M_elems[2] = 0.3;
  a3._M_elems[3] = 0.4;
  a3._M_elems[0] = 0.1;
  a3._M_elems[1] = 0.2;
  std::operator<<((ostream *)&std::cout,"a1[2]: ");
}

Assistant:

int vector_and_array () {
    using namespace std;
    //  default array, in "stack"
    double a1[4] = {1.2, 2.4, 3.6, 4.8};

    //  vector, use "heap" to store data
    vector<double> a2(4);
    a2[0] = 1.1;
    a2[1] = 1.2;
    a2[2] = 1.3;
    a2[3] = 1.4;

    //  array in c++11, use "stack" to store data
    array<double, 4> a3 = {0.1, 0.2, 0.3, 0.4};
    array<double, 4> a4 = a3;

    cout << "a1[2]: " << a1[2] << " at " << &a1[2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    //  danger operation
    a1[-2] = 11.3;

    cout << "a1[-2]: " << a1[-2] << " at " << &a1[-2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    return 0;
}